

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Buffer::remove_samples(Blip_Buffer *this,long count)

{
  uint uVar1;
  ulong uVar2;
  
  if (count != 0) {
    uVar1 = this->offset_ + (int)count * -0x10000;
    this->offset_ = uVar1;
    uVar2 = (ulong)(uVar1 >> 0x10);
    memmove(this->buffer_,this->buffer_ + count,uVar2 * 4 + 0x48);
    memset(this->buffer_ + uVar2 + 0x12,0,count << 2);
    return;
  }
  return;
}

Assistant:

void Blip_Buffer::remove_samples( long count )
{
	if ( count )
	{
		remove_silence( count );
		
		// copy remaining samples to beginning and clear old samples
		long remain = samples_avail() + blip_buffer_extra_;
		memmove( buffer_, buffer_ + count, remain * sizeof *buffer_ );
		memset( buffer_ + remain, 0, count * sizeof *buffer_ );
	}
}